

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_merge.hpp
# Opt level: O0

void __thiscall
optimization::mergeBlocks::Merge_Block::optimize_func(Merge_Block *this,MirFunction *func)

{
  bool bVar1;
  size_type sVar2;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *this_00;
  pointer ppVar3;
  size_type sVar4;
  long in_RSI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar5;
  mapped_type *subBlk_1;
  mapped_type *subBlk;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator __end6;
  iterator __begin6;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range6;
  iterator end_iter;
  mapped_type *preBlk;
  BasicBlk *blk;
  pair<const_int,_mir::inst::BasicBlk> *blkiter;
  iterator __end3;
  iterator __begin3;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range3;
  bool flag;
  JumpInstruction *in_stack_fffffffffffffed8;
  JumpInstructionKind in_stack_fffffffffffffee0;
  JumpKind in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  LabelId in_stack_fffffffffffffeec;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffef8;
  undefined1 in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff01;
  JumpInstruction local_c0;
  reference local_88;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_80;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_78;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  mapped_type *local_48;
  BasicBlk *local_40;
  reference local_38;
  _Self local_30;
  _Self local_28;
  long local_20;
  byte local_11;
  long local_10;
  
  local_10 = in_RSI;
  do {
    local_11 = 0;
    local_20 = local_10 + 0x68;
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)in_stack_fffffffffffffed8);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
         ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffffed8);
LAB_00164bfd:
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) goto LAB_00164ff1;
    local_38 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x164c28)
    ;
    local_40 = &local_38->second;
    if ((100000 < (local_38->second).id) ||
       (sVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)0x164c6b), sVar2 != 1))
    {
LAB_00164fdf:
      std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      goto LAB_00164bfd;
    }
    this_00 = (map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
               *)(local_10 + 0x68);
    local_50 = (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          in_stack_fffffffffffffed8);
    std::_Rb_tree_const_iterator<int>::operator*
              ((_Rb_tree_const_iterator<int> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    local_48 = std::
               map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
               ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                     *)CONCAT71(in_stack_ffffffffffffff01,in_stack_ffffffffffffff00),
                    (key_type *)in_stack_fffffffffffffef8._M_node);
    local_58 = (_Base_ptr)
               std::
               map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
               ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                      *)in_stack_fffffffffffffed8);
    local_60 = (_Base_ptr)
               std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator--
                         ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                          in_stack_fffffffffffffee4);
    local_68 = (_Base_ptr)
               std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator--
                         ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                          in_stack_fffffffffffffee4);
    if ((local_40->jump).kind == Return) {
      in_stack_fffffffffffffeec = local_48->id;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator->
                         ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x164d32)
      ;
      if (in_stack_fffffffffffffeec != ppVar3->first) goto LAB_00164fdf;
    }
    if (((local_48->jump).kind != Br) || ((local_48->jump).bb_true != local_40->id))
    goto LAB_00164fdf;
    local_70 = &local_40->inst;
    local_78._M_current =
         (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
         std::
         vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  *)in_stack_fffffffffffffed8);
    local_80 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
               std::
               vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                      *)in_stack_fffffffffffffed8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                              (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                               *)in_stack_fffffffffffffed8), bVar1) {
      local_88 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                 ::operator*(&local_78);
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                  (value_type *)in_stack_fffffffffffffed8);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator++(&local_78);
    }
    in_stack_fffffffffffffee0 = (local_40->jump).kind;
    in_stack_fffffffffffffee4 = (local_40->jump).bb_true;
    in_stack_fffffffffffffee8 = (local_40->jump).bb_false;
    std::optional<mir::inst::VarId>::optional
              ((optional<mir::inst::VarId> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (optional<mir::inst::VarId> *)in_stack_fffffffffffffed8);
    mir::inst::JumpInstruction::JumpInstruction
              ((JumpInstruction *)CONCAT71(in_stack_ffffffffffffff01,in_stack_ffffffffffffff00),
               (JumpInstructionKind)((ulong)in_stack_fffffffffffffef8._M_node >> 0x20),
               (int)in_stack_fffffffffffffef8._M_node,(int)((ulong)this_00 >> 0x20),
               (optional<mir::inst::VarId> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
               in_stack_fffffffffffffee4);
    mir::inst::JumpInstruction::operator=
              ((JumpInstruction *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
    mir::inst::JumpInstruction::~JumpInstruction(&local_c0);
    sVar4 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::count(this_00,(key_type *)
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    if (sVar4 != 0) {
      std::
      map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
      ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            *)CONCAT71(in_stack_ffffffffffffff01,in_stack_ffffffffffffff00),
           (key_type *)in_stack_fffffffffffffef8._M_node);
      std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (key_type *)in_stack_fffffffffffffed8);
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                 CONCAT71(in_stack_ffffffffffffff01,in_stack_ffffffffffffff00),
                 (value_type_conflict3 *)in_stack_fffffffffffffef8._M_node);
    }
    sVar4 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::count(this_00,(key_type *)
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    if (sVar4 != 0) {
      std::
      map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
      ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            *)CONCAT71(in_stack_ffffffffffffff01,in_stack_ffffffffffffff00),
           (key_type *)in_stack_fffffffffffffef8._M_node);
      std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (key_type *)in_stack_fffffffffffffed8);
      pVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)
                         CONCAT71(in_stack_ffffffffffffff01,in_stack_ffffffffffffff00),
                         (value_type_conflict3 *)in_stack_fffffffffffffef8._M_node);
      in_stack_fffffffffffffef8 = pVar5.first._M_node;
      in_stack_ffffffffffffff00 = pVar5.second;
    }
    local_11 = 1;
    std::
    map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
    ::erase((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
            (key_type *)in_stack_fffffffffffffed8);
LAB_00164ff1:
    if ((local_11 & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void optimize_func(mir::inst::MirFunction& func) {
    while (true) {
      bool flag = false;
      for (auto& blkiter : func.basic_blks) {
        auto& blk = blkiter.second;
        if (blk.id > 100000) {
          continue;
        }
        if (blk.preceding.size() == 1) {
          auto& preBlk = func.basic_blks.at(*blk.preceding.begin());
          auto end_iter = func.basic_blks.end();
          end_iter--;
          end_iter--;
          if (blk.jump.kind == mir::inst::JumpInstructionKind::Return &&
              preBlk.id !=
                  end_iter->first) {  // in this case, merge will cause the
                                      // end block's id is not the largest
            continue;
          }

          if (preBlk.jump.kind == mir::inst::JumpInstructionKind::Br &&
              preBlk.jump.bb_true == blk.id) {
            for (auto& inst : blk.inst) {
              preBlk.inst.push_back(std::move(inst));
            }
            preBlk.jump = mir::inst::JumpInstruction(
                blk.jump.kind, blk.jump.bb_true, blk.jump.bb_false,
                blk.jump.cond_or_ret, blk.jump.jump_kind);
            if (func.basic_blks.count(preBlk.jump.bb_true)) {
              auto& subBlk = func.basic_blks.at(preBlk.jump.bb_true);
              subBlk.preceding.erase(blk.id);
              subBlk.preceding.insert(preBlk.id);
            }
            if (func.basic_blks.count(preBlk.jump.bb_false)) {
              auto& subBlk = func.basic_blks.at(preBlk.jump.bb_false);
              subBlk.preceding.erase(blk.id);
              subBlk.preceding.insert(preBlk.id);
            }
            flag = true;
            func.basic_blks.erase(blk.id);
            break;
          }
        }
      }
      if (!flag) {
        break;
      }
    }
  }